

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O2

void __thiscall
LinkageUntangler::select_linear_anchors
          (LinkageUntangler *this,int min_links,int min_transitive_links)

{
  SequenceDistanceGraph *pSVar1;
  pointer pNVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  ulong __n;
  ulong uVar7;
  long lVar8;
  reference rVar9;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  
  __n = 1;
  do {
    pSVar1 = (*(DistanceGraph **)this)->sdg;
    pNVar2 = (pSVar1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pSVar1->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pNVar2) / 0x38) <= __n) {
      return;
    }
    if (pNVar2[__n].status != Deleted) {
      DistanceGraph::fw_neighbours_by_distance(&fw_sorted,*(DistanceGraph **)this,__n,min_links);
      if ((ulong)((long)fw_sorted.
                        super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)fw_sorted.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
LAB_001f890f:
        DistanceGraph::fw_neighbours_by_distance(&bw_sorted,*(DistanceGraph **)this,-__n,min_links);
        bVar5 = true;
        if (0x10 < (ulong)((long)bw_sorted.
                                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bw_sorted.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          lVar8 = 0x18;
          uVar7 = 0xffffffffffffffff;
          do {
            uVar7 = uVar7 + 1;
            if (((long)bw_sorted.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)bw_sorted.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar7)
            goto LAB_001f8990;
            uVar6 = DistanceGraph::link_count
                              (*(DistanceGraph **)this,
                               -*(long *)((long)&bw_sorted.
                                                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].first
                                         + lVar8),
                               *(sgNodeID_t *)
                                ((long)&(bw_sorted.
                                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar8))
            ;
            lVar8 = lVar8 + 0x10;
          } while ((uint)min_transitive_links <= uVar6);
          bVar5 = false;
        }
LAB_001f8990:
        bVar3 = fw_sorted.
                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                fw_sorted.
                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
        bVar4 = bw_sorted.
                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                bw_sorted.
                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
        std::_Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::
        ~_Vector_base(&bw_sorted.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                     );
        if ((bVar5) && (bVar3 || bVar4)) {
          rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)(this + 8),__n);
          *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
        }
      }
      else {
        lVar8 = 0x18;
        uVar7 = 0xffffffffffffffff;
        do {
          uVar7 = uVar7 + 1;
          if (((long)fw_sorted.
                     super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)fw_sorted.
                     super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar7)
          goto LAB_001f890f;
          uVar6 = DistanceGraph::link_count
                            (*(DistanceGraph **)this,
                             -*(long *)((long)&fw_sorted.
                                               super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].first +
                                       lVar8),
                             *(sgNodeID_t *)
                              ((long)&(fw_sorted.
                                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar8));
          lVar8 = lVar8 + 0x10;
        } while ((uint)min_transitive_links <= uVar6);
      }
      std::_Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Vector_base
                (&fw_sorted.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void LinkageUntangler::select_linear_anchors(int min_links, int min_transitive_links) {
    for (auto n=1;n<dg.sdg.nodes.size();++n){
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        bool anchor=true;
        auto fw_sorted=dg.fw_neighbours_by_distance(n,min_links);
        if (fw_sorted.size()>1) {
            for (auto i = 0; i < fw_sorted.size() - 1; ++i) {
                if (dg.link_count(-fw_sorted[i].second, fw_sorted[i + 1].second) < min_transitive_links) {
                    anchor = false;
                    break;
                }
            }
        }
        if (anchor) {
            auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
            if (bw_sorted.size()>1) {
                for (auto i = 0; i < bw_sorted.size() - 1; ++i) {
                    if (dg.link_count(-bw_sorted[i].second, bw_sorted[i + 1].second) < min_transitive_links) {
                        anchor = false;
                        break;
                    }
                }
            }
            if (bw_sorted.empty() and fw_sorted.empty()) anchor=false;
        }
        if (anchor) {
                selected_nodes[n] = true;
        }
    }
}